

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O2

String * __thiscall indigox::Atom::ToString_abi_cxx11_(String *__return_storage_ptr__,Atom *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  poVar1 = std::operator<<(poVar1," \"");
  poVar1 = std::operator<<(poVar1,(string *)&this->name_);
  poVar1 = std::operator<<(poVar1,"\" @ (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->pos_)._M_elems[0]);
  poVar1 = std::operator<<(poVar1,",");
  std::ostream::operator<<(poVar1,(this->pos_)._M_elems[1]);
  poVar1 = std::operator<<(local_190,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->pos_)._M_elems[2]);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

String Atom::ToString() {
    std::stringstream ss;
    ss << idx_ << " \"" << name_ << "\" @ (" << pos_[0] << "," << pos_[1] ;
    ss << "," << pos_[2] << ")";
    return ss.str();
  }